

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O3

double smf::MidiMessage::frequencyToSemitones(double frequency,double a4frequency)

{
  double dVar1;
  double dVar2;
  
  dVar1 = 0.0;
  if ((1.0 <= frequency) && (0.0 < a4frequency)) {
    dVar1 = log2(frequency / a4frequency);
    dVar2 = dVar1 * 12.0 + 69.0;
    dVar1 = 0.0;
    if (0.0 <= dVar2) {
      dVar1 = dVar2;
    }
    dVar1 = (double)(~-(ulong)(dVar2 < 128.0) & 0x405fc00000000000 |
                    (ulong)dVar1 & -(ulong)(dVar2 < 128.0));
  }
  return dVar1;
}

Assistant:

double MidiMessage::frequencyToSemitones(double frequency, double a4frequency) {
	if (frequency < 1) {
		return 0.0;
	}
	if (a4frequency <= 0) {
		return 0.0;
	}
	double semitones = 69.0 + 12.0 * log2(frequency/a4frequency);
	if (semitones >= 128.0) {
		return 127.0;
	} else if (semitones < 0.0) {
		return 0.0;
	}
	return semitones;
}